

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask22_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x16 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 10;
  *puVar1 = in[2] << 0xc | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 0x14;
  *puVar1 = in[3] << 2 | *puVar1;
  *puVar1 = in[4] << 0x18 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] >> 8;
  *puVar1 = in[5] << 0xe | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] >> 0x12;
  *puVar1 = in[6] << 4 | *puVar1;
  *puVar1 = in[7] << 0x1a | *puVar1;
  out[5] = in[7] >> 6;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask22_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;

  return out + 1;
}